

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

lyxp_set * set_copy(lyxp_set *set)

{
  uint32_t uVar1;
  LY_ERR *pLVar2;
  lyxp_set_nodes *plVar3;
  char *pcVar4;
  lyxp_set *ret;
  lyxp_set *set_local;
  
  if (set == (lyxp_set *)0x0) {
    set_local = (lyxp_set *)0x0;
  }
  else {
    set_local = (lyxp_set *)malloc(0x30);
    if (set_local == (lyxp_set *)0x0) {
      pLVar2 = ly_errno_location();
      *pLVar2 = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","set_copy");
      set_local = (lyxp_set *)0x0;
    }
    else if ((set->type == LYXP_SET_NODE_SET) || (set->type == LYXP_SET_SNODE_SET)) {
      set_local->type = set->type;
      plVar3 = (lyxp_set_nodes *)malloc((ulong)set->used << 4);
      (set_local->val).nodes = plVar3;
      if ((set_local->val).nodes == (lyxp_set_nodes *)0x0) {
        pLVar2 = ly_errno_location();
        *pLVar2 = LY_EMEM;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","set_copy");
        free(set_local);
        set_local = (lyxp_set *)0x0;
      }
      else {
        memcpy((set_local->val).nodes,(set->val).nodes,(ulong)set->used << 4);
        uVar1 = set->used;
        set_local->size = uVar1;
        set_local->used = uVar1;
        set_local->ctx_pos = set->ctx_pos;
        set_local->ctx_size = set->ctx_size;
      }
    }
    else {
      memcpy(set_local,set,0x30);
      if (set->type == LYXP_SET_STRING) {
        pcVar4 = strdup((set->val).str);
        (set_local->val).str = pcVar4;
      }
    }
  }
  return set_local;
}

Assistant:

static struct lyxp_set *
set_copy(struct lyxp_set *set)
{
    struct lyxp_set *ret;

    if (!set) {
        return NULL;
    }

    ret = malloc(sizeof *ret);
    if (!ret) {
        LOGMEM;
        return NULL;
    }
    if ((set->type == LYXP_SET_NODE_SET) || (set->type == LYXP_SET_SNODE_SET)) {
        ret->type = set->type;
        ret->val.nodes = malloc(set->used * sizeof *ret->val.nodes);
        if (!ret->val.nodes) {
            LOGMEM;
            free(ret);
            return NULL;
        }
        memcpy(ret->val.nodes, set->val.nodes, set->used * sizeof *ret->val.nodes);

        ret->used = ret->size = set->used;
        ret->ctx_pos = set->ctx_pos;
        ret->ctx_size = set->ctx_size;
    } else {
       memcpy(ret, set, sizeof *ret);
       if (set->type == LYXP_SET_STRING) {
           ret->val.str = strdup(set->val.str);
       }
    }

    return ret;
}